

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactBvh.cpp
# Opt level: O3

void __thiscall cbtBvhTree::build_tree(cbtBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  void *pvVar7;
  int endIndex;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  
  *(undefined4 *)this = 0;
  endIndex = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size;
  uVar6 = *(uint *)(this + 0xc);
  iVar10 = endIndex * 2;
  if ((int)uVar6 < iVar10) {
    lVar11 = (long)(int)uVar6;
    if (*(int *)(this + 0x10) < iVar10) {
      if (endIndex == 0) {
        pvVar7 = (void *)0x0;
      }
      else {
        pvVar7 = cbtAlignedAllocInternal((long)endIndex * 0x48,0x10);
        uVar6 = *(uint *)(this + 0xc);
      }
      if (0 < (int)uVar6) {
        lVar8 = 0;
        do {
          lVar3 = *(long *)(this + 0x18);
          uVar4 = ((undefined8 *)(lVar3 + lVar8))[1];
          *(undefined8 *)((long)pvVar7 + lVar8) = *(undefined8 *)(lVar3 + lVar8);
          ((undefined8 *)((long)pvVar7 + lVar8))[1] = uVar4;
          puVar1 = (undefined8 *)(lVar3 + 0x10 + lVar8);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pvVar7 + lVar8 + 0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          *(undefined4 *)((long)pvVar7 + lVar8 + 0x20) = *(undefined4 *)(lVar3 + 0x20 + lVar8);
          lVar8 = lVar8 + 0x24;
        } while ((ulong)uVar6 * 0x24 != lVar8);
      }
      if ((*(void **)(this + 0x18) != (void *)0x0) && (this[0x20] == (cbtBvhTree)0x1)) {
        cbtAlignedFreeInternal(*(void **)(this + 0x18));
      }
      this[0x20] = (cbtBvhTree)0x1;
      *(void **)(this + 0x18) = pvVar7;
      *(int *)(this + 0x10) = iVar10;
    }
    auVar12 = vpbroadcastq_avx512f();
    auVar13 = vpaddq_avx512f(auVar12,_DAT_009f0d00);
    auVar12 = vpaddq_avx512f(auVar12,_DAT_009f0d40);
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpbroadcastq_avx512f(ZEXT816(0x24));
    auVar17 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar18 = vpbroadcastq_avx512f();
    uVar9 = 0;
    do {
      auVar19 = vpbroadcastq_avx512f();
      auVar20 = vpmullq_avx512dq(auVar12,auVar16);
      uVar9 = uVar9 + 0x10;
      auVar12 = vpaddq_avx512f(auVar12,auVar17);
      auVar21 = vporq_avx512f(auVar19,auVar14);
      auVar19 = vporq_avx512f(auVar19,auVar15);
      uVar4 = vpcmpuq_avx512f(auVar19,auVar18,2);
      auVar19 = vpmullq_avx512dq(auVar13,auVar16);
      uVar5 = vpcmpuq_avx512f(auVar21,auVar18,2);
      auVar13 = vpaddq_avx512f(auVar13,auVar17);
      vpscatterqd_avx512f(ZEXT832(*(long *)(this + 0x18) + 0x20U) + auVar20._0_32_,uVar5,
                          SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      vpscatterqd_avx512f(ZEXT832(*(long *)(this + 0x18) + 0x20U) + auVar19._0_32_,uVar4,
                          SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    } while (((iVar10 - lVar11) + 0xfU & 0xfffffffffffffff0) != uVar9);
    endIndex = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size;
  }
  *(int *)(this + 0xc) = iVar10;
  _build_sub_tree(this,primitive_boxes,0,endIndex);
  return;
}

Assistant:

void cbtBvhTree::build_tree(
	GIM_BVH_DATA_ARRAY& primitive_boxes)
{
	// initialize node count to 0
	m_num_nodes = 0;
	// allocate nodes
	m_node_array.resize(primitive_boxes.size() * 2);

	_build_sub_tree(primitive_boxes, 0, primitive_boxes.size());
}